

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool *bufPool,buffer_t buf)

{
  uint uVar1;
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  void *__ptr;
  
  __ptr = buf.start;
  if (__ptr == (void *)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  uVar1 = bufPool->nbBuffers;
  if (uVar1 < bufPool->totalBuffers) {
    bufPool->nbBuffers = uVar1 + 1;
    bufPool->bTable[uVar1].start = __ptr;
    bufPool->bTable[uVar1].capacity = buf.capacity;
    pthread_mutex_unlock((pthread_mutex_t *)bufPool);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  UNRECOVERED_JUMPTABLE = (bufPool->cMem).customFree;
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)((bufPool->cMem).opaque,__ptr);
    return;
  }
  free(__ptr);
  return;
}

Assistant:

static void ZSTDMT_releaseBuffer(ZSTDMT_bufferPool* bufPool, buffer_t buf)
{
    DEBUGLOG(5, "ZSTDMT_releaseBuffer");
    if (buf.start == NULL) return;   /* compatible with release on NULL */
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers < bufPool->totalBuffers) {
        bufPool->bTable[bufPool->nbBuffers++] = buf;  /* stored for later use */
        DEBUGLOG(5, "ZSTDMT_releaseBuffer: stored buffer of size %u in slot %u",
                    (U32)buf.capacity, (U32)(bufPool->nbBuffers-1));
        ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
        return;
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* Reached bufferPool capacity (should not happen) */
    DEBUGLOG(5, "ZSTDMT_releaseBuffer: pool capacity reached => freeing ");
    ZSTD_free(buf.start, bufPool->cMem);
}